

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardHeader::QWizardHeader(QWizardHeader *this,QWidget *parent)

{
  QWidget *this_00;
  QLabel *pQVar1;
  QLayout *this_01;
  long in_FS_OFFSET;
  QMargins local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007df508;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QWizardHeader_007df6b8;
  QPixmap::QPixmap(&this->bannerPixmap);
  QWidget::setSizePolicy(&this->super_QWidget,(QSizePolicy)0x70000);
  QWidget::setBackgroundRole(&this->super_QWidget,Base);
  this_00 = (QWidget *)operator_new(0x28);
  QLabel::QLabel((QLabel *)this_00,&this->super_QWidget,(WindowFlags)0x0);
  this->titleLabel = (QLabel *)this_00;
  QWidget::setBackgroundRole(this_00,Base);
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->subTitleLabel = pQVar1;
  QLabel::setAlignment(pQVar1,(Alignment)0x21);
  QLabel::setWordWrap(this->subTitleLabel,true);
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->logoLabel = pQVar1;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_48,&((this->titleLabel->super_QFrame).super_QWidget.data)->fnt);
  QFont::setWeight((Weight)(QFont *)&local_48);
  QWidget::setFont((QWidget *)this->titleLabel,(QFont *)&local_48);
  this_01 = (QLayout *)operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)this_01,&this->super_QWidget);
  this->layout = (QGridLayout *)this_01;
  local_58.m_left.m_i = 0;
  local_58.m_top.m_i = 0;
  local_58.m_right.m_i = 0;
  local_58.m_bottom.m_i = 0;
  QLayout::setContentsMargins(this_01,&local_58);
  (**(code **)(*(long *)&this->layout->super_QLayout + 0x68))(this->layout,0);
  QGridLayout::setRowMinimumHeight(this->layout,3,1);
  QGridLayout::setRowStretch(this->layout,4,1);
  QGridLayout::setColumnStretch(this->layout,2,1);
  QGridLayout::setColumnMinimumWidth(this->layout,4,10);
  QGridLayout::setColumnMinimumWidth(this->layout,6,5);
  QGridLayout::addWidget(this->layout,(QWidget *)this->titleLabel,2,1,1,2,(Alignment)0x0);
  QGridLayout::addWidget(this->layout,(QWidget *)this->subTitleLabel,4,2,(Alignment)0x0);
  QGridLayout::addWidget(this->layout,(QWidget *)this->logoLabel,1,5,5,1,(Alignment)0x0);
  QFont::~QFont((QFont *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWizardHeader::QWizardHeader(QWidget *parent)
    : QWidget(parent)
{
    setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Fixed);
    setBackgroundRole(QPalette::Base);

    titleLabel = new QLabel(this);
    titleLabel->setBackgroundRole(QPalette::Base);

    subTitleLabel = new QLabel(this);
    subTitleLabel->setAlignment(Qt::AlignTop | Qt::AlignLeft);
    subTitleLabel->setWordWrap(true);

    logoLabel = new QLabel(this);

    QFont font = titleLabel->font();
    font.setBold(true);
    titleLabel->setFont(font);

    layout = new QGridLayout(this);
    layout->setContentsMargins(QMargins());
    layout->setSpacing(0);

    layout->setRowMinimumHeight(3, 1);
    layout->setRowStretch(4, 1);

    layout->setColumnStretch(2, 1);
    layout->setColumnMinimumWidth(4, 2 * GapBetweenLogoAndRightEdge);
    layout->setColumnMinimumWidth(6, GapBetweenLogoAndRightEdge);

    layout->addWidget(titleLabel, 2, 1, 1, 2);
    layout->addWidget(subTitleLabel, 4, 2);
    layout->addWidget(logoLabel, 1, 5, 5, 1);
}